

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O3

string * __thiscall
ROM::Description::description_abi_cxx11_(string *__return_storage_ptr__,Description *this,int flags)

{
  pointer pbVar1;
  long lVar2;
  uint uVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_name;
  pointer pbVar6;
  char *pcVar7;
  uint uVar8;
  _Rb_tree_header *p_Var9;
  bool bVar10;
  stringstream output;
  char local_1c1;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar8 = flags & 0xfffffffd;
  if ((this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    uVar8 = flags;
  }
  if ((uVar8 & 4) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(this->descriptive_name)._M_dataplus._M_p,
               (this->descriptive_name)._M_string_length);
    if (uVar8 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
LAB_003b9936:
      if ((uVar8 & 1) != 0) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes",6);
        uVar3 = uVar8 & 0xfffffffa;
        uVar8 = uVar8 & 0xfffffffa;
        if (uVar3 == 0) goto LAB_003b9a99;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; ",2);
      }
      if ((uVar8 & 2) != 0) {
        bVar10 = (this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_node_count < 2;
        pcVar7 = "usual crc32: ";
        if (!bVar10) {
          pcVar7 = "usual crc32s: ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pcVar7,0xe - (ulong)bVar10);
        p_Var5 = (this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var9 = &(this->crc32s)._M_t._M_impl.super__Rb_tree_header;
        local_1c0 = __return_storage_ptr__;
        if ((_Rb_tree_header *)p_Var5 != p_Var9) {
          bVar10 = true;
          do {
            if (!bVar10) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            }
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
            lVar2 = *(long *)(local_1a8[0] + -0x18);
            if (acStack_c8[lVar2 + 1] == '\0') {
              std::ios::widen((char)(ostream *)local_1a8 + (char)lVar2);
              acStack_c8[lVar2 + 1] = '\x01';
            }
            acStack_c8[lVar2] = '0';
            *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 8;
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
            bVar10 = false;
          } while ((_Rb_tree_header *)p_Var5 != p_Var9);
        }
        __return_storage_ptr__ = local_1c0;
        if ((uVar8 & 0xfffffffd) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
          std::__cxx11::stringbuf::str();
          goto LAB_003b9aba;
        }
      }
    }
  }
  else {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->machine_name)._M_dataplus._M_p,
                        (this->machine_name)._M_string_length);
    local_1c1 = '/';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_1c1,1);
    pbVar6 = (this->file_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->file_names).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 == 0x20) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
      pbVar6 = (this->file_names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (this->file_names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_1c0 = __return_storage_ptr__;
      if (pbVar6 != pbVar1) {
        bVar10 = true;
        do {
          if (!bVar10) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," or ",4);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
          pbVar6 = pbVar6 + 1;
          bVar10 = false;
        } while (pbVar6 != pbVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
      __return_storage_ptr__ = local_1c0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(this->descriptive_name)._M_dataplus._M_p,
               (this->descriptive_name)._M_string_length);
    uVar3 = uVar8 & 0xfffffffb;
    uVar8 = uVar8 & 0xfffffffb;
    if (uVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; ",2);
      goto LAB_003b9936;
    }
LAB_003b9a99:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
  }
  std::__cxx11::stringbuf::str();
LAB_003b9aba:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Description::description(int flags) const {
	std::stringstream output;

	// If there are no CRCs, don't output them.
	if(crc32s.empty()) flags &= ~DescriptionFlag::CRC;

	// Print the file name(s) and the descriptive name.
	if(flags & DescriptionFlag::Filename) {
		flags &= ~DescriptionFlag::Filename;

		output << machine_name << '/';
		if(file_names.size() == 1) {
			output << file_names[0];
		} else {
			output << "{";
			bool is_first = true;
			for(const auto &file_name: file_names) {
				if(!is_first) output << " or ";
				output << file_name;
				is_first = false;
			}
			output << "}";
		}
		output << " (" << descriptive_name;
		if(!flags) {
			output << ")";
			return output.str();
		}
		output << "; ";
	} else {
		output << descriptive_name;
		if(!flags) {
			return output.str();
		}
		output << " (";
	}

	// Print the size.
	if(flags & DescriptionFlag::Size) {
		flags &= ~DescriptionFlag::Size;
		output << size << " bytes";

		if(!flags) {
			output << ")";
			return output.str();
		}
		output << "; ";
	}

	// Print the CRC(s).
	if(flags & DescriptionFlag::CRC) {
		flags &= ~DescriptionFlag::CRC;

		output << ((crc32s.size() > 1) ? "usual crc32s: " : "usual crc32: ");
		bool is_first = true;
		for(const auto crc32: crc32s) {
			if(!is_first) output << ", ";
			is_first = false;
			output << std::hex << std::setfill('0') << std::setw(8) << crc32;
		}

		if(!flags) {
			output << ")";
			return output.str();
		}
	}

	return output.str();
}